

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O2

void CreateBackwardReferencesNH4
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               BrotliEncoderParams *params,HasherHandle hasher,int *dist_cache,
               size_t *last_insert_len,Command_conflict *commands,size_t *num_commands,
               size_t *num_literals)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ushort uVar4;
  BrotliDictionary *pBVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint8_t uVar13;
  byte bVar14;
  size_t sVar15;
  long lVar16;
  ulong uVar17;
  uint8_t *puVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  uint16_t uVar24;
  int iVar25;
  uint32_t uVar26;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  uint *puVar31;
  ulong uVar32;
  uint uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  long lVar39;
  ulong uVar40;
  bool bVar41;
  ulong local_138;
  ulong local_130;
  ulong local_128;
  int local_fc;
  ulong local_f8;
  ulong local_d8;
  Command_conflict *local_c8;
  int local_b4;
  ulong local_90;
  uint local_78;
  
  uVar8 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  uVar3 = (position - 7) + num_bytes;
  sVar15 = position;
  if (7 < num_bytes) {
    sVar15 = uVar3;
  }
  lVar16 = 0x200;
  if (params->quality < 9) {
    lVar16 = 0x40;
  }
  uVar1 = position + num_bytes;
  lVar2 = position - 1;
  uVar30 = *last_insert_len;
  uVar34 = lVar16 + position;
  local_c8 = commands;
  do {
LAB_0010e593:
    uVar28 = position;
    if (uVar1 <= uVar28 + 8) {
      *last_insert_len = (uVar30 + uVar1) - uVar28;
      *num_commands = *num_commands + ((long)local_c8 - (long)commands >> 4);
      return;
    }
    local_f8 = uVar1 - uVar28;
    uVar12 = uVar8;
    if (uVar28 < uVar8) {
      uVar12 = uVar28;
    }
    uVar9 = uVar28 & ringbuffer_mask;
    lVar39 = *(long *)(ringbuffer + uVar9);
    local_128 = (ulong)*dist_cache;
    uVar35 = 0x7e4;
    local_78 = (uint)ringbuffer_mask;
    uVar13 = (uint8_t)lVar39;
    if ((uVar28 - local_128 < uVar28) &&
       (uVar11 = (ulong)((uint)(uVar28 - local_128) & local_78), ringbuffer[uVar11] == uVar13)) {
      uVar23 = local_f8 & 0xfffffffffffffff8;
      uVar29 = 0;
      lVar19 = 0;
LAB_0010e619:
      if (local_f8 >> 3 == uVar29) {
        uVar10 = (ulong)((uint)local_f8 & 7);
        for (; (bVar41 = uVar10 != 0, uVar10 = uVar10 - 1, uVar29 = local_f8, bVar41 &&
               (uVar29 = uVar23, ringbuffer[uVar23 + uVar11] == ringbuffer[uVar23 + uVar9]));
            uVar23 = uVar23 + 1) {
        }
      }
      else {
        if (*(ulong *)(ringbuffer + uVar29 * 8 + uVar9) ==
            *(ulong *)(ringbuffer + uVar29 * 8 + uVar11)) break;
        uVar29 = *(ulong *)(ringbuffer + uVar29 * 8 + uVar11) ^
                 *(ulong *)(ringbuffer + uVar29 * 8 + uVar9);
        uVar11 = 0;
        if (uVar29 != 0) {
          for (; (uVar29 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
          }
        }
        uVar29 = (uVar11 >> 3 & 0x1fffffff) - lVar19;
      }
      if ((uVar29 < 4) || (uVar11 = uVar29 * 0x87 + 0x78f, uVar11 < 0x7e5)) {
        local_128 = 0;
        uVar29 = 0;
      }
      else {
        uVar13 = ringbuffer[uVar29 + uVar9];
        uVar35 = uVar11;
      }
    }
    else {
      local_128 = 0;
      uVar29 = 0;
    }
    uVar11 = (params->dist).max_distance;
    puVar31 = (uint *)(hasher + ((ulong)(lVar39 * -0x42e1ca5843000000) >> 0x2f) * 4 + 0x28);
    for (iVar25 = 0; iVar25 != 4; iVar25 = iVar25 + 1) {
      uVar7 = *puVar31;
      uVar33 = local_78 & uVar7;
      if (((uVar13 == ringbuffer[uVar29 + uVar33]) && (uVar28 != uVar7)) &&
         (uVar23 = uVar28 - uVar7, uVar23 <= uVar12)) {
        uVar10 = 0;
        lVar19 = 0;
LAB_0010e6ca:
        uVar40 = (ulong)((uint)local_f8 & 7);
        uVar17 = local_f8 & 0xfffffffffffffff8;
        if (local_f8 >> 3 == uVar10) {
          for (; (uVar10 = local_f8, uVar40 != 0 &&
                 (uVar10 = uVar17, ringbuffer[uVar17 + uVar33] == ringbuffer[uVar17 + uVar9]));
              uVar17 = uVar17 + 1) {
            uVar40 = uVar40 - 1;
          }
        }
        else {
          if (*(ulong *)(ringbuffer + uVar10 * 8 + uVar9) ==
              *(ulong *)(ringbuffer + uVar10 * 8 + (ulong)uVar33)) goto code_r0x0010e6e1;
          uVar40 = *(ulong *)(ringbuffer + uVar10 * 8 + (ulong)uVar33) ^
                   *(ulong *)(ringbuffer + uVar10 * 8 + uVar9);
          uVar10 = 0;
          if (uVar40 != 0) {
            for (; (uVar40 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
            }
          }
          uVar10 = (uVar10 >> 3 & 0x1fffffff) - lVar19;
        }
        if (3 < uVar10) {
          iVar22 = 0x1f;
          if ((uint)uVar23 != 0) {
            for (; (uint)uVar23 >> iVar22 == 0; iVar22 = iVar22 + -1) {
            }
          }
          uVar40 = (ulong)(iVar22 * -0x1e + 0x780) + uVar10 * 0x87;
          if (uVar35 < uVar40) {
            uVar13 = ringbuffer[uVar10 + uVar9];
            uVar29 = uVar10;
            uVar35 = uVar40;
            local_128 = uVar23;
          }
        }
      }
      puVar31 = puVar31 + 1;
    }
    local_fc = 0;
    if (uVar35 == 0x7e4) {
      uVar23 = *(ulong *)(hasher + 0x18);
      local_130 = *(ulong *)(hasher + 0x20);
      uVar35 = 0x7e4;
      if (uVar23 >> 7 <= local_130) {
        local_d8._0_4_ = (int)lVar39;
        uVar10 = (ulong)((uint)((int)local_d8 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
        bVar41 = true;
        local_fc = 0;
        while (bVar41) {
          uVar4 = (params->dictionary).hash_table[uVar10];
          uVar23 = uVar23 + 1;
          *(ulong *)(hasher + 0x18) = uVar23;
          if (uVar4 != 0) {
            uVar7 = uVar4 & 0x1f;
            uVar40 = (ulong)uVar7;
            if (uVar40 <= local_f8) {
              pBVar5 = (params->dictionary).words;
              lVar19 = (ulong)pBVar5->offsets_by_length[uVar40] + uVar40 * (uVar4 >> 5);
              uVar33 = (uint)uVar4;
              uVar17 = (ulong)(uVar33 & 0x18);
              uVar36 = 0;
LAB_0010e846:
              if ((uVar4 & 0x18) == uVar36) {
                uVar20 = (ulong)(uVar33 & 7);
                puVar18 = pBVar5->data + uVar36 + lVar19;
                for (; (bVar41 = uVar20 != 0, uVar20 = uVar20 - 1, uVar36 = (ulong)(uVar33 & 0x1f),
                       bVar41 && (uVar36 = uVar17, ringbuffer[uVar17 + uVar9] == *puVar18));
                    uVar17 = uVar17 + 1) {
                  puVar18 = puVar18 + 1;
                }
              }
              else {
                uVar20 = *(ulong *)(pBVar5->data + uVar36 + lVar19);
                if (uVar20 == *(ulong *)(ringbuffer + uVar36 + uVar9)) goto code_r0x0010e861;
                uVar20 = *(ulong *)(ringbuffer + uVar36 + uVar9) ^ uVar20;
                uVar17 = 0;
                if (uVar20 != 0) {
                  for (; (uVar20 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                  }
                }
                uVar36 = (uVar17 >> 3 & 0x1fffffff) + uVar36;
              }
              if (((uVar36 != 0) && (uVar40 < (params->dictionary).cutoffTransformsCount + uVar36))
                 && (uVar40 = (ulong)(uVar4 >> 5) + uVar12 + 1 +
                              ((ulong)((uint)((params->dictionary).cutoffTransforms >>
                                             ((char)(uVar40 - uVar36) * '\x06' & 0x3fU)) & 0x3f) +
                               (uVar40 - uVar36) * 4 << (pBVar5->size_bits_by_length[uVar40] & 0x3f)
                              ), uVar40 <= uVar11)) {
                iVar25 = 0x1f;
                if ((uint)uVar40 != 0) {
                  for (; (uint)uVar40 >> iVar25 == 0; iVar25 = iVar25 + -1) {
                  }
                }
                uVar17 = (uVar36 * 0x87 - (ulong)(uint)(iVar25 * 0x1e)) + 0x780;
                if (uVar35 <= uVar17) {
                  local_fc = uVar7 - (int)uVar36;
                  local_130 = local_130 + 1;
                  *(ulong *)(hasher + 0x20) = local_130;
                  uVar35 = uVar17;
                  uVar29 = uVar36;
                  local_128 = uVar40;
                }
              }
            }
          }
          uVar10 = uVar10 + 1;
          bVar41 = false;
        }
      }
    }
    *(int *)(hasher + (ulong)((uint)((ulong)(lVar39 * -0x42e1ca5843000000) >> 0x2f) +
                             ((uint)(uVar28 >> 3) & 3)) * 4 + 0x28) = (int)uVar28;
    if (uVar35 < 0x7e5) {
      uVar30 = uVar30 + 1;
      position = uVar28 + 1;
      if (uVar34 < position) {
        if ((uint)((int)lVar16 * 4) + uVar34 < position) {
          uVar12 = uVar28 + 0x11;
          if (uVar3 <= uVar28 + 0x11) {
            uVar12 = uVar3;
          }
          for (; position < uVar12; position = position + 4) {
            *(int *)(hasher + (ulong)((uint)((ulong)(*(long *)(ringbuffer +
                                                              (position & ringbuffer_mask)) *
                                                    -0x42e1ca5843000000) >> 0x2f) +
                                     ((uint)(position >> 3) & 3)) * 4 + 0x28) = (int)position;
            uVar30 = uVar30 + 4;
          }
        }
        else {
          uVar12 = uVar28 + 9;
          if (uVar3 <= uVar28 + 9) {
            uVar12 = uVar3;
          }
          for (; position < uVar12; position = position + 2) {
            *(int *)(hasher + (ulong)((uint)((ulong)(*(long *)(ringbuffer +
                                                              (position & ringbuffer_mask)) *
                                                    -0x42e1ca5843000000) >> 0x2f) +
                                     ((uint)(position >> 3) & 3)) * 4 + 0x28) = (int)position;
            uVar30 = uVar30 + 2;
          }
        }
      }
      goto LAB_0010e593;
    }
    iVar25 = *dist_cache;
    uVar12 = (lVar2 + num_bytes) - uVar28;
    local_b4 = 0;
    uVar34 = uVar30;
    do {
      uVar23 = (ulong)((uint)uVar12 & 7);
      local_f8 = local_f8 - 1;
      uVar9 = uVar29 - 1;
      if (local_f8 <= uVar29 - 1) {
        uVar9 = local_f8;
      }
      if (4 < params->quality) {
        uVar9 = 0;
      }
      uVar10 = uVar28 + 1;
      local_d8 = uVar8;
      if (uVar10 < uVar8) {
        local_d8 = uVar10;
      }
      uVar17 = uVar10 & ringbuffer_mask;
      uVar13 = ringbuffer[uVar9 + uVar17];
      uVar36 = uVar10 - (long)iVar25;
      uVar40 = 0x7e4;
      if (uVar36 < uVar10) {
        uVar7 = (uint)uVar36 & local_78;
        if (uVar13 == ringbuffer[uVar9 + uVar7]) {
          uVar36 = 0;
          lVar39 = 0;
LAB_0010ebb6:
          if (uVar12 >> 3 == uVar36) {
            uVar20 = uVar23;
            for (uVar36 = -lVar39;
                (bVar41 = uVar20 != 0, uVar20 = uVar20 - 1, bVar41 &&
                (ringbuffer[uVar36 + uVar7] == ringbuffer[uVar36 + uVar17])); uVar36 = uVar36 + 1) {
            }
          }
          else {
            if (*(ulong *)(ringbuffer + uVar36 * 8 + uVar17) ==
                *(ulong *)(ringbuffer + uVar36 * 8 + (ulong)uVar7)) goto code_r0x0010ebd1;
            uVar20 = *(ulong *)(ringbuffer + uVar36 * 8 + (ulong)uVar7) ^
                     *(ulong *)(ringbuffer + uVar36 * 8 + uVar17);
            uVar36 = 0;
            if (uVar20 != 0) {
              for (; (uVar20 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
              }
            }
            uVar36 = (uVar36 >> 3 & 0x1fffffff) - lVar39;
          }
          if ((uVar36 < 4) || (uVar20 = uVar36 * 0x87 + 0x78f, uVar20 < 0x7e5)) {
            local_138 = 0;
          }
          else {
            uVar13 = ringbuffer[uVar36 + uVar17];
            uVar40 = uVar20;
            uVar9 = uVar36;
            local_138 = (long)iVar25;
          }
        }
        else {
          local_138 = 0;
        }
      }
      else {
        local_138 = 0;
      }
      uVar36 = *(long *)(ringbuffer + uVar17) * -0x42e1ca5843000000;
      puVar31 = (uint *)(hasher + (uVar36 >> 0x2f) * 4 + 0x28);
      for (iVar22 = 0; iVar22 != 4; iVar22 = iVar22 + 1) {
        uVar7 = *puVar31;
        uVar33 = local_78 & uVar7;
        if (((uVar13 == ringbuffer[uVar9 + uVar33]) && (uVar10 != uVar7)) &&
           (uVar20 = uVar10 - uVar7, uVar20 <= local_d8)) {
          uVar37 = 0;
          lVar39 = 0;
LAB_0010ecb8:
          if (uVar12 >> 3 == uVar37) {
            uVar21 = uVar23;
            for (uVar37 = -lVar39;
                (bVar41 = uVar21 != 0, uVar21 = uVar21 - 1, bVar41 &&
                (ringbuffer[uVar37 + uVar33] == ringbuffer[uVar37 + uVar17])); uVar37 = uVar37 + 1)
            {
            }
          }
          else {
            if (*(ulong *)(ringbuffer + uVar37 * 8 + uVar17) ==
                *(ulong *)(ringbuffer + uVar37 * 8 + (ulong)uVar33)) goto code_r0x0010eccf;
            uVar21 = *(ulong *)(ringbuffer + uVar37 * 8 + (ulong)uVar33) ^
                     *(ulong *)(ringbuffer + uVar37 * 8 + uVar17);
            uVar37 = 0;
            if (uVar21 != 0) {
              for (; (uVar21 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
              }
            }
            uVar37 = (uVar37 >> 3 & 0x1fffffff) - lVar39;
          }
          if (3 < uVar37) {
            iVar6 = 0x1f;
            if ((uint)uVar20 != 0) {
              for (; (uint)uVar20 >> iVar6 == 0; iVar6 = iVar6 + -1) {
              }
            }
            uVar21 = (ulong)(iVar6 * -0x1e + 0x780) + uVar37 * 0x87;
            if (uVar40 < uVar21) {
              uVar13 = ringbuffer[uVar37 + uVar17];
              uVar40 = uVar21;
              uVar9 = uVar37;
              local_138 = uVar20;
            }
          }
        }
        puVar31 = puVar31 + 1;
      }
      iVar22 = 0;
      if (uVar40 == 0x7e4) {
        uVar23 = *(ulong *)(hasher + 0x18);
        local_90 = *(ulong *)(hasher + 0x20);
        uVar40 = 0x7e4;
        if (uVar23 >> 7 <= local_90) {
          local_130._0_4_ = (uint)*(long *)(ringbuffer + uVar17);
          uVar20 = (ulong)((uint)local_130 * 0x1e35a7bd >> 0x11 & 0xfffffffe);
          bVar41 = true;
          uVar40 = 0x7e4;
          iVar22 = 0;
          while (bVar41) {
            uVar4 = (params->dictionary).hash_table[uVar20];
            uVar23 = uVar23 + 1;
            *(ulong *)(hasher + 0x18) = uVar23;
            if (uVar4 != 0) {
              uVar7 = uVar4 & 0x1f;
              uVar37 = (ulong)uVar7;
              if (uVar37 <= local_f8) {
                pBVar5 = (params->dictionary).words;
                lVar39 = (ulong)pBVar5->offsets_by_length[uVar37] + uVar37 * (uVar4 >> 5);
                uVar21 = (ulong)(uVar4 & 0x18);
                uVar38 = 0;
LAB_0010ee7a:
                if ((uVar4 & 0x18) == uVar38) {
                  uVar32 = (ulong)(uVar4 & 7);
                  puVar18 = pBVar5->data + uVar38 + lVar39;
                  for (; (bVar41 = uVar32 != 0, uVar32 = uVar32 - 1, uVar38 = (ulong)(uVar4 & 0x1f),
                         bVar41 && (uVar38 = uVar21, ringbuffer[uVar21 + uVar17] == *puVar18));
                      uVar21 = uVar21 + 1) {
                    puVar18 = puVar18 + 1;
                  }
                }
                else {
                  uVar32 = *(ulong *)(pBVar5->data + uVar38 + lVar39);
                  if (uVar32 == *(ulong *)(ringbuffer + uVar38 + uVar17)) goto code_r0x0010ee95;
                  uVar32 = *(ulong *)(ringbuffer + uVar38 + uVar17) ^ uVar32;
                  uVar21 = 0;
                  if (uVar32 != 0) {
                    for (; (uVar32 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                    }
                  }
                  uVar38 = (uVar21 >> 3 & 0x1fffffff) + uVar38;
                }
                if (((uVar38 != 0) && (uVar37 < (params->dictionary).cutoffTransformsCount + uVar38)
                    ) && (uVar37 = (ulong)(uVar4 >> 5) + local_d8 + 1 +
                                   ((ulong)((uint)((params->dictionary).cutoffTransforms >>
                                                  ((char)(uVar37 - uVar38) * '\x06' & 0x3fU)) & 0x3f
                                           ) + (uVar37 - uVar38) * 4 <<
                                   (pBVar5->size_bits_by_length[uVar37] & 0x3f)), uVar37 <= uVar11))
                {
                  iVar6 = 0x1f;
                  if ((uint)uVar37 != 0) {
                    for (; (uint)uVar37 >> iVar6 == 0; iVar6 = iVar6 + -1) {
                    }
                  }
                  uVar21 = (uVar38 * 0x87 - (ulong)(uint)(iVar6 * 0x1e)) + 0x780;
                  if (uVar40 <= uVar21) {
                    iVar22 = uVar7 - (int)uVar38;
                    local_90 = local_90 + 1;
                    *(ulong *)(hasher + 0x20) = local_90;
                    uVar40 = uVar21;
                    uVar9 = uVar38;
                    local_138 = uVar37;
                  }
                }
              }
            }
            uVar20 = uVar20 + 1;
            bVar41 = false;
          }
        }
      }
      *(int *)(hasher + (ulong)((uint)(uVar36 >> 0x2f) + ((uint)(uVar10 >> 3) & 3)) * 4 + 0x28) =
           (int)uVar10;
      if (uVar40 < uVar35 + 0xaf) {
        uVar10 = uVar28;
        uVar23 = uVar34;
        uVar9 = uVar29;
        local_d8 = uVar8;
        iVar22 = local_fc;
        if (uVar28 < uVar8) {
          local_d8 = uVar28;
        }
        break;
      }
      local_128 = local_138;
      uVar23 = uVar30 + 4;
      if (local_b4 == 3) break;
      uVar23 = uVar34 + 1;
      local_b4 = local_b4 + 1;
      uVar17 = uVar28 + 9;
      uVar12 = uVar12 - 1;
      uVar35 = uVar40;
      uVar29 = uVar9;
      uVar28 = uVar10;
      uVar34 = uVar23;
      local_fc = iVar22;
    } while (uVar17 < uVar1);
    if (local_d8 < local_128) {
LAB_0010f0c2:
      uVar34 = local_128 + 0xf;
LAB_0010f0c6:
      if ((local_128 <= local_d8) && (uVar34 != 0)) {
        dist_cache[3] = dist_cache[2];
        *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
        *dist_cache = (int)local_128;
      }
    }
    else {
      if (local_128 != (long)*dist_cache) {
        uVar34 = 1;
        if (local_128 != (long)dist_cache[1]) {
          uVar34 = (local_128 + 3) - (long)*dist_cache;
          if (uVar34 < 7) {
            bVar14 = (byte)((int)uVar34 << 2);
            uVar7 = 0x9750468;
          }
          else {
            uVar34 = (local_128 + 3) - (long)dist_cache[1];
            if (6 < uVar34) {
              uVar34 = 2;
              if ((local_128 != (long)dist_cache[2]) &&
                 (uVar34 = 3, local_128 != (long)dist_cache[3])) goto LAB_0010f0c2;
              goto LAB_0010f0c6;
            }
            bVar14 = (byte)((int)uVar34 << 2);
            uVar7 = 0xfdb1ace;
          }
          uVar34 = (ulong)(uVar7 >> (bVar14 & 0x1f) & 0xf);
        }
        goto LAB_0010f0c6;
      }
      uVar34 = 0;
    }
    local_c8->insert_len_ = (uint32_t)uVar23;
    local_130._0_4_ = (uint)uVar9;
    local_c8->copy_len_ = iVar22 << 0x19 | (uint)local_130;
    uVar28 = (ulong)(params->dist).num_direct_distance_codes;
    uVar30 = uVar28 + 0x10;
    uVar26 = 0;
    if (uVar30 <= uVar34) {
      uVar7 = (params->dist).distance_postfix_bits;
      bVar14 = (byte)uVar7;
      uVar28 = ((uVar34 - uVar28) + (4L << (bVar14 & 0x3f))) - 0x10;
      uVar33 = 0x1f;
      uVar27 = (uint)uVar28;
      if (uVar27 != 0) {
        for (; uVar27 >> uVar33 == 0; uVar33 = uVar33 - 1) {
        }
      }
      uVar33 = (uVar33 ^ 0xffffffe0) + 0x1f;
      uVar12 = (ulong)((uVar28 >> ((ulong)uVar33 & 0x3f) & 1) != 0);
      lVar39 = (ulong)uVar33 - (ulong)uVar7;
      uVar34 = (~(-1 << (bVar14 & 0x1f)) & uVar27) + uVar30 +
               (uVar12 + lVar39 * 2 + 0xfffe << (bVar14 & 0x3f)) | lVar39 * 0x400;
      uVar26 = (uint32_t)(uVar28 - (uVar12 + 2 << ((byte)uVar33 & 0x3f)) >> (bVar14 & 0x3f));
    }
    local_c8->dist_prefix_ = (uint16_t)uVar34;
    local_c8->dist_extra_ = uVar26;
    if (uVar23 < 6) {
      uVar30 = uVar23 & 0xffffffff;
    }
    else if (uVar23 < 0x82) {
      uVar7 = 0x1f;
      uVar33 = (uint)(uVar23 - 2);
      if (uVar33 != 0) {
        for (; uVar33 >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      uVar30 = (ulong)((int)(uVar23 - 2 >> ((char)(uVar7 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                       (uVar7 ^ 0xffffffe0) * 2 + 0x40);
    }
    else if (uVar23 < 0x842) {
      uVar33 = (uint32_t)uVar23 - 0x42;
      uVar7 = 0x1f;
      if (uVar33 != 0) {
        for (; uVar33 >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      uVar30 = (ulong)((uVar7 ^ 0xffe0) + 0x2a);
    }
    else {
      uVar30 = 0x15;
      if (0x1841 < uVar23) {
        uVar30 = (ulong)(ushort)(0x17 - (uVar23 < 0x5842));
      }
    }
    local_130._0_4_ = iVar22 + (uint)local_130;
    if ((uint)local_130 < 10) {
      uVar7 = (uint)local_130 - 2;
    }
    else if ((uint)local_130 < 0x86) {
      local_130._0_4_ = (uint)local_130 - 6;
      uVar7 = 0x1f;
      if ((uint)local_130 != 0) {
        for (; (uint)local_130 >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      uVar7 = ((uint)local_130 >> ((char)(uVar7 ^ 0xffffffe0) + 0x1fU & 0x1f)) +
              (uVar7 ^ 0xffffffe0) * 2 + 0x42;
    }
    else {
      uVar7 = 0x17;
      if ((uint)local_130 < 0x846) {
        uVar7 = 0x1f;
        if ((uint)local_130 - 0x46 != 0) {
          for (; (uint)local_130 - 0x46 >> uVar7 == 0; uVar7 = uVar7 - 1) {
          }
        }
        uVar7 = (uVar7 ^ 0xffe0) + 0x2c;
      }
    }
    uVar4 = (ushort)uVar7;
    uVar24 = (uVar4 & 7) + ((ushort)uVar30 & 7) * 8;
    if ((((uVar34 & 0x3ff) == 0) && ((ushort)uVar30 < 8)) && (uVar4 < 0x10)) {
      if (7 < uVar4) {
        uVar24 = uVar24 + 0x40;
      }
    }
    else {
      iVar25 = (int)((uVar30 & 0xffff) >> 3) * 3 + ((uVar7 & 0xffff) >> 3);
      uVar24 = uVar24 + ((ushort)(0x520d40 >> ((char)iVar25 * '\x02' & 0x1fU)) & 0xc0) +
                        (short)iVar25 * 0x40 + 0x40;
    }
    local_c8->cmd_prefix_ = uVar24;
    *num_literals = *num_literals + uVar23;
    position = uVar9 + uVar10;
    uVar30 = sVar15;
    if (position < sVar15) {
      uVar30 = position;
    }
    uVar28 = uVar10 + 2;
    if (local_128 < uVar9 >> 2) {
      uVar34 = position + local_128 * -4;
      if (uVar34 < uVar28) {
        uVar34 = uVar28;
      }
      uVar28 = uVar34;
      if (uVar30 < uVar34) {
        uVar28 = uVar30;
      }
    }
    uVar34 = uVar10 + lVar16 + uVar9 * 2;
    local_c8 = local_c8 + 1;
    for (; uVar28 < uVar30; uVar28 = uVar28 + 1) {
      *(int *)(hasher + (ulong)((uint)((ulong)(*(long *)(ringbuffer + (uVar28 & ringbuffer_mask)) *
                                              -0x42e1ca5843000000) >> 0x2f) +
                               ((uint)(uVar28 >> 3) & 3)) * 4 + 0x28) = (int)uVar28;
    }
    uVar30 = 0;
  } while( true );
  lVar19 = lVar19 + -8;
  uVar29 = uVar29 + 1;
  goto LAB_0010e619;
code_r0x0010e6e1:
  lVar19 = lVar19 + -8;
  uVar10 = uVar10 + 1;
  goto LAB_0010e6ca;
code_r0x0010e861:
  uVar36 = uVar36 + 8;
  goto LAB_0010e846;
code_r0x0010ebd1:
  lVar39 = lVar39 + -8;
  uVar36 = uVar36 + 1;
  goto LAB_0010ebb6;
code_r0x0010eccf:
  lVar39 = lVar39 + -8;
  uVar37 = uVar37 + 1;
  goto LAB_0010ecb8;
code_r0x0010ee95:
  uVar38 = uVar38 + 8;
  goto LAB_0010ee7a;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    const BrotliEncoderParams* params, HasherHandle hasher, int* dist_cache,
    size_t* last_insert_len, Command* commands, size_t* num_commands,
    size_t* num_literals) {
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(hasher, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(hasher, &params->dictionary,
                         ringbuffer, ringbuffer_mask, dist_cache, position,
                         max_length, max_distance, gap,
                         params->dist.max_distance, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        FN(FindLongestMatch)(hasher, &params->dictionary,
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, gap, params->dist.max_distance, &sr2);
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code =
            ComputeDistanceCode(sr.distance, max_distance + gap, dist_cache);
        if ((sr.distance <= (max_distance + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(hasher, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(hasher, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}